

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesCommand.cxx
# Opt level: O2

string * FindInstallSource_abi_cxx11_
                   (string *__return_storage_ptr__,cmMakefile *makefile,char *name)

{
  bool bVar1;
  size_type sVar2;
  string *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type *psVar5;
  string ts;
  char local_69;
  string local_68;
  char *local_48;
  string local_40;
  
  local_48 = name;
  bVar1 = cmsys::SystemTools::FileIsFullPath(name);
  if (bVar1) {
LAB_0036ef7f:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,name,(allocator<char> *)&local_68);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,name,(allocator<char> *)&local_40);
  sVar2 = cmGeneratorExpression::Find(&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (sVar2 == 0) goto LAB_0036ef7f;
  psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(makefile);
  local_40._M_dataplus._M_p._0_1_ = 0x2f;
  cmStrCat<std::__cxx11::string_const&,char,char_const*&>
            (&local_68,psVar3,(char *)&local_40,&local_48);
  psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(makefile);
  local_69 = '/';
  cmStrCat<std::__cxx11::string_const&,char,char_const*&>(&local_40,psVar3,&local_69,&local_48);
  bVar1 = cmsys::SystemTools::FileExists(&local_68);
  if (bVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    bVar1 = cmsys::SystemTools::FileExists(&local_40);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (bVar1) {
      paVar4 = &local_40.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) == paVar4) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_40.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_40.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p =
             (pointer)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_);
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_40.field_2._M_allocated_capacity;
      }
      psVar3 = &local_40;
      goto LAB_0036eff9;
    }
  }
  paVar4 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == paVar4) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_68.field_2._M_allocated_capacity
    ;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_68.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_68._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_68.field_2._M_allocated_capacity
    ;
  }
  psVar3 = &local_68;
LAB_0036eff9:
  psVar5 = &psVar3->_M_string_length;
  __return_storage_ptr__->_M_string_length = *psVar5;
  (((string *)(psVar5 + -1))->_M_dataplus)._M_p = (pointer)paVar4;
  *psVar5 = 0;
  paVar4->_M_local_buf[0] = '\0';
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

static std::string FindInstallSource(cmMakefile& makefile, const char* name)
{
  if (cmSystemTools::FileIsFullPath(name) ||
      cmGeneratorExpression::Find(name) == 0) {
    // This is a full path.
    return name;
  }

  // This is a relative path.
  std::string tb = cmStrCat(makefile.GetCurrentBinaryDirectory(), '/', name);
  std::string ts = cmStrCat(makefile.GetCurrentSourceDirectory(), '/', name);

  if (cmSystemTools::FileExists(tb)) {
    // The file exists in the binary tree.  Use it.
    return tb;
  }
  if (cmSystemTools::FileExists(ts)) {
    // The file exists in the source tree.  Use it.
    return ts;
  }
  // The file doesn't exist.  Assume it will be present in the
  // binary tree when the install occurs.
  return tb;
}